

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_MultiplicativeExprPrecedence_Test::~ExprWriterTest_MultiplicativeExprPrecedence_Test
          (ExprWriterTest_MultiplicativeExprPrecedence_Test *this)

{
  ExprWriterTest_MultiplicativeExprPrecedence_Test *in_stack_00000010;
  
  ~ExprWriterTest_MultiplicativeExprPrecedence_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_F(ExprWriterTest, MultiplicativeExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1), x3 = MakeVariable(2);
  CHECK_WRITE("x1 * x2 * x3",
      MakeBinary(ex::MUL, MakeBinary(ex::MUL, x1, x2), x3));
  CHECK_WRITE("x1 * x2 / x3",
      MakeBinary(ex::DIV, MakeBinary(ex::MUL, x1, x2), x3));
  CHECK_WRITE("x1 * x2 div x3",
      MakeBinary(ex::TRUNC_DIV, MakeBinary(ex::MUL, x1, x2), x3));
  CHECK_WRITE("x1 * x2 mod x3",
      MakeBinary(ex::MOD, MakeBinary(ex::MUL, x1, x2), x3));
  CHECK_WRITE("x1 * (x2 * x3)",
      MakeBinary(ex::MUL, x1, MakeBinary(ex::MUL, x2, x3)));
  CHECK_WRITE("(x1 * x2) ^ x3",
      MakeBinary(ex::POW, MakeBinary(ex::MUL, x1, x2), x3));
  CHECK_WRITE("(x1 + x2) * x3",
      MakeBinary(ex::MUL, MakeBinary(ex::ADD, x1, x2), x3));
}